

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spvIR.h
# Opt level: O0

StorageClass __thiscall spv::Module::getStorageClass(Module *this,Id typeId)

{
  Op OVar1;
  StorageClass SVar2;
  const_reference ppIVar3;
  Id typeId_local;
  Module *this_local;
  
  ppIVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                      (&this->idToInstruction,(ulong)typeId);
  OVar1 = spv::Instruction::getOpCode(*ppIVar3);
  if (OVar1 == OpTypePointer) {
    ppIVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (&this->idToInstruction,(ulong)typeId);
    SVar2 = spv::Instruction::getImmediateOperand(*ppIVar3,0);
    return SVar2;
  }
  __assert_fail("idToInstruction[typeId]->getOpCode() == spv::OpTypePointer",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/spvIR.h"
                ,0x200,"StorageClass spv::Module::getStorageClass(Id) const");
}

Assistant:

StorageClass getStorageClass(Id typeId) const
    {
        assert(idToInstruction[typeId]->getOpCode() == spv::OpTypePointer);
        return (StorageClass)idToInstruction[typeId]->getImmediateOperand(0);
    }